

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

DisasJumpType op_ectg(DisasContext_conflict13 *s,DisasOps *o)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int b2;
  TCGContext_conflict12 *s_00;
  TCGv_i64 val;
  uint uVar5;
  TCGTemp *ret;
  TCGTemp *pTVar6;
  TCGv_i64 addr;
  uintptr_t o_2;
  uintptr_t o_1;
  TCGTemp *local_38;
  
  uVar5 = (s->fields).presentO;
  if (((((uVar5 >> 8 & 1) != 0) && ((uVar5 >> 0xb & 1) != 0)) && ((uVar5 >> 9 & 1) != 0)) &&
     (((uVar5 >> 0xc & 1) != 0 && ((uVar5 & 4) != 0)))) {
    s_00 = s->uc->tcg_ctx;
    iVar1 = (s->fields).c[0];
    iVar2 = (s->fields).c[4];
    iVar3 = (s->fields).c[1];
    iVar4 = (s->fields).c[5];
    b2 = (s->fields).c[2];
    ret = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
    pTVar6 = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
    o->in1 = (TCGv_i64)((long)pTVar6 - (long)s_00);
    tcg_gen_addi_i64_s390x(s_00,(TCGv_i64)((long)pTVar6 - (long)s_00),s_00->regs[iVar1],(long)iVar2)
    ;
    pTVar6 = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
    o->in2 = (TCGv_i64)((long)pTVar6 - (long)s_00);
    tcg_gen_addi_i64_s390x(s_00,(TCGv_i64)((long)pTVar6 - (long)s_00),s_00->regs[iVar3],(long)iVar4)
    ;
    addr = get_address(s,0,b2,0);
    o->addr1 = addr;
    val = s_00->regs[b2];
    uVar5 = get_mem_index((DisasContext_conflict13 *)(ulong)((s->base).tb)->flags);
    tcg_gen_qemu_ld_i64_s390x(s_00,val,addr,(ulong)uVar5,MO_BEQ);
    local_38 = (TCGTemp *)(s_00->cpu_env + (long)s_00);
    tcg_gen_callN_s390x(s_00,helper_stpt,ret,1,&local_38);
    tcg_gen_sub_i64(s_00,s_00->regs[0],o->in1,(TCGv_i64)((long)ret - (long)s_00));
    if (s_00->regs[1] != o->in2) {
      tcg_gen_op2_s390x(s_00,INDEX_op_mov_i64,(TCGArg)(s_00->regs[1] + (long)s_00),
                        (TCGArg)(o->in2 + (long)s_00));
    }
    tcg_temp_free_internal_s390x(s_00,ret);
    return DISAS_NEXT;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_ectg(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int b1 = get_field(s, b1);
    int d1 = get_field(s, d1);
    int b2 = get_field(s, b2);
    int d2 = get_field(s, d2);
    int r3 = get_field(s, r3);
    TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);

    /* fetch all operands first */
    o->in1 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_addi_i64(tcg_ctx, o->in1, tcg_ctx->regs[b1], d1);
    o->in2 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_addi_i64(tcg_ctx, o->in2, tcg_ctx->regs[b2], d2);
    o->addr1 = get_address(s, 0, r3, 0);

    /* load the third operand into r3 before modifying anything */
    tcg_gen_qemu_ld64(tcg_ctx, tcg_ctx->regs[r3], o->addr1, get_mem_index(s));

    /* subtract CPU timer from first operand and store in GR0 */
    gen_helper_stpt(tcg_ctx, tmp, tcg_ctx->cpu_env);
    tcg_gen_sub_i64(tcg_ctx, tcg_ctx->regs[0], o->in1, tmp);

    /* store second operand in GR1 */
    tcg_gen_mov_i64(tcg_ctx, tcg_ctx->regs[1], o->in2);

    tcg_temp_free_i64(tcg_ctx, tmp);
    return DISAS_NEXT;
}